

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HdlcSimulationDataGenerator.cpp
# Opt level: O0

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
HdlcSimulationDataGenerator::GenAddressField
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          HdlcSimulationDataGenerator *this,HdlcAddressType addressType,U64 addressBytes,U8 value)

{
  byte local_42;
  undefined1 local_41;
  uint local_40;
  U8 extValue;
  U8 mask;
  U32 i;
  undefined1 local_2a;
  byte local_29;
  U64 UStack_28;
  U8 value_local;
  U64 addressBytes_local;
  HdlcSimulationDataGenerator *pHStack_18;
  HdlcAddressType addressType_local;
  HdlcSimulationDataGenerator *this_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *addrRet;
  
  local_2a = 0;
  local_29 = value;
  UStack_28 = addressBytes;
  addressBytes_local._4_4_ = addressType;
  pHStack_18 = this;
  this_local = (HdlcSimulationDataGenerator *)__return_storage_ptr__;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(__return_storage_ptr__);
  if (addressBytes_local._4_4_ == HDLC_BASIC_ADDRESS_FIELD) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              (__return_storage_ptr__,&local_29);
  }
  else {
    for (local_40 = 0; local_40 < UStack_28; local_40 = local_40 + 1) {
      local_41 = (ulong)local_40 != UStack_28 - 1;
      local_42 = local_29 & 0xfe | local_41;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                (__return_storage_ptr__,&local_42);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

vector<U8> HdlcSimulationDataGenerator::GenAddressField( HdlcAddressType addressType, U64 addressBytes, U8 value ) const
{
    vector<U8> addrRet;
    if( addressType == HDLC_BASIC_ADDRESS_FIELD )
    {
        addrRet.push_back( value );
    }
    else // addressType == HDLC_EXTENDED_ADDRESS_FIELD
    {
        for( U32 i = 0; i < addressBytes; ++i )
        {
            U8 mask = ( i == addressBytes - 1 ) ? 0x00 : 0x01; // EA bit (Lsb is set to 1 to extend the address recursively)
            U8 extValue = ( value & 0xFE ) | mask;
            addrRet.push_back( extValue );
        }
    }
    return addrRet;
}